

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListExpression.cpp
# Opt level: O0

void __thiscall hdc::ListExpression::addExpression(ListExpression *this,Expression *expression)

{
  Expression *local_18;
  Expression *expression_local;
  ListExpression *this_local;
  
  local_18 = expression;
  expression_local = &this->super_Expression;
  std::vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::push_back
            (&this->expressions,&local_18);
  ASTNode::setParentNode((ASTNode *)local_18,(ASTNode *)this);
  return;
}

Assistant:

void ListExpression::addExpression(Expression* expression) {
    expressions.push_back(expression);
    expression->setParentNode(this);
}